

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::isFeasibilePoint
          (ConstraintsGroup *this,double time,VectorDynSize *state,VectorDynSize *control)

{
  _Hash_node_base *p_Var1;
  long *plVar2;
  bool bVar3;
  undefined1 uVar4;
  reverse_iterator constraintIterator;
  pointer local_38;
  pointer local_30;
  pointer local_28;
  
  bVar3 = isAnyTimeGroup(this);
  if (bVar3) {
    p_Var1 = ((this->m_pimpl->group)._M_h._M_before_begin._M_nxt[5]._M_nxt)->_M_nxt;
    uVar4 = (*(code *)p_Var1->_M_nxt[2]._M_nxt)(time,p_Var1,state,control);
    return (bool)uVar4;
  }
  local_30 = (this->m_pimpl->orderedIntervals).
             super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_28 = (this->m_pimpl->orderedIntervals).
             super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>>,__gnu_cxx::__ops::_Iter_pred<iDynTree::optimalcontrol::ConstraintsGroup::ConstraintsGroupPimpl::findActiveConstraint(double)::_lambda(std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>const&)_1_>>
            (time,&local_38);
  if (local_38 ==
      (this->m_pimpl->orderedIntervals).
      super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 1;
  }
  else {
    plVar2 = *(long **)&(local_38[-1].
                         super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->constraint;
    uVar4 = (**(code **)(*plVar2 + 0x10))(time,plVar2,state,control);
  }
  return (bool)uVar4;
}

Assistant:

bool ConstraintsGroup::isFeasibilePoint(double time, const VectorDynSize &state, const VectorDynSize &control)
        {
            if (isAnyTimeGroup()) {
                return m_pimpl->group.begin()->second.get()->constraint->isFeasiblePoint(time, state, control);
            }

            std::vector< TimedConstraint_ptr >::reverse_iterator constraintIterator = m_pimpl->findActiveConstraint(time);
            if (constraintIterator == m_pimpl->orderedIntervals.rend()) {//it means that there are no constraints at that time
                return true;
            }

            return constraintIterator->get()->constraint->isFeasiblePoint(time, state, control);
        }